

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_constants_sha(uint32_t prefix,size_t iter,uchar *expected32)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  secp256k1_scratch *psVar4;
  ulong extraout_RAX;
  code *pcVar5;
  long lVar6;
  secp256k1_scalar *psVar7;
  secp256k1_scalar *psVar8;
  ulong uVar9;
  secp256k1_scratch *scratch;
  secp256k1_gej *r;
  size_t sVar10;
  ulong uVar11;
  byte *out32;
  secp256k1_ge *elem;
  uchar *p2;
  code *cb;
  secp256k1_scalar *cbdata;
  secp256k1_sha256 *hash;
  secp256k1_gej *hash_00;
  secp256k1_sha256 *acc;
  secp256k1_gej *r_00;
  secp256k1_gej *psVar12;
  uchar inp [6];
  uchar b32 [32];
  ulong uStack_1578;
  secp256k1_strauss_state sStack_1560;
  secp256k1_fe asStack_1548 [8];
  secp256k1_strauss_point_state sStack_1408;
  secp256k1_ge asStack_ff8 [8];
  size_t *psStack_d30;
  secp256k1_gej *psStack_d28;
  secp256k1_gej *psStack_d20;
  secp256k1_gej *psStack_d18;
  secp256k1_gej *psStack_d10;
  secp256k1_strauss_point_state *psStack_d08;
  size_t sStack_ce8;
  secp256k1_scalar sStack_ce0;
  secp256k1_scratch asStack_cc0 [2];
  secp256k1_ge sStack_c78;
  secp256k1_gej sStack_c20;
  secp256k1_gej sStack_ba0;
  secp256k1_gej sStack_b20;
  secp256k1_gej sStack_aa0;
  secp256k1_gej sStack_a20;
  secp256k1_gej asStack_9a0 [2];
  secp256k1_gej asStack_860 [5];
  secp256k1_strauss_point_state sStack_5a0;
  size_t sStack_188;
  secp256k1_sha256 *psStack_180;
  secp256k1_scratch *psStack_178;
  secp256k1_sha256 *psStack_170;
  size_t sStack_168;
  code *pcStack_160;
  uint32_t local_156;
  undefined2 local_152;
  uchar *local_150;
  byte local_148 [32];
  undefined1 local_128 [40];
  uchar auStack_100 [88];
  undefined8 local_a8;
  secp256k1_sha256 local_98;
  
  out32 = (byte *)(ulong)prefix;
  pcStack_160 = (code *)0x16454a;
  local_150 = expected32;
  psVar4 = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  acc = &local_98;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  sVar10 = 0;
  local_98.bytes = 0;
  hash = (secp256k1_sha256 *)local_128;
  local_128._0_4_ = 0;
  local_128._4_4_ = 0;
  local_128._8_4_ = 0;
  local_128._12_4_ = 0;
  local_128._16_4_ = 0;
  local_128._20_4_ = 0;
  local_128._24_4_ = 0;
  local_128._28_4_ = 0;
  pcStack_160 = (code *)0x164597;
  local_156 = prefix;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar4);
  local_128._0_4_ = 1;
  local_128._4_4_ = 0;
  local_128._8_4_ = 0;
  local_128._12_4_ = 0;
  local_128._16_4_ = 0;
  local_128._20_4_ = 0;
  local_128._24_4_ = 0;
  local_128._28_4_ = 0;
  pcStack_160 = (code *)0x1645bb;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar4);
  pcStack_160 = (code *)0x1645c6;
  secp256k1_scalar_negate((secp256k1_scalar *)hash,(secp256k1_scalar *)hash);
  pcStack_160 = (code *)0x1645d4;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar4);
  if (iter != 0) {
    sVar10 = 0;
    hash = (secp256k1_sha256 *)(local_128 + 0x20);
    out32 = local_148;
    acc = (secp256k1_sha256 *)local_128;
    do {
      local_152 = (undefined2)sVar10;
      local_128[0x20] = 'g';
      local_128[0x21] = 0xe6;
      local_128[0x22] = '\t';
      local_128[0x23] = 'j';
      local_128[0x24] = 0x85;
      local_128[0x25] = 0xae;
      local_128[0x26] = 'g';
      local_128[0x27] = 0xbb;
      auStack_100[0] = 'r';
      auStack_100[1] = 0xf3;
      auStack_100[2] = 'n';
      auStack_100[3] = '<';
      auStack_100[4] = ':';
      auStack_100[5] = 0xf5;
      auStack_100[6] = 'O';
      auStack_100[7] = 0xa5;
      auStack_100[8] = '\x7f';
      auStack_100[9] = 'R';
      auStack_100[10] = '\x0e';
      auStack_100[0xb] = 'Q';
      auStack_100[0xc] = 0x8c;
      auStack_100[0xd] = 'h';
      auStack_100[0xe] = '\x05';
      auStack_100[0xf] = 0x9b;
      auStack_100[0x10] = 0xab;
      auStack_100[0x11] = 0xd9;
      auStack_100[0x12] = 0x83;
      auStack_100[0x13] = '\x1f';
      auStack_100[0x14] = '\x19';
      auStack_100[0x15] = 0xcd;
      auStack_100[0x16] = 0xe0;
      auStack_100[0x17] = '[';
      local_a8 = 0;
      pcStack_160 = (code *)0x164625;
      secp256k1_sha256_write(hash,(uchar *)&local_156,6);
      pcStack_160 = (code *)0x164630;
      secp256k1_sha256_finalize(hash,out32);
      pcStack_160 = (code *)0x16463d;
      secp256k1_scalar_set_b32((secp256k1_scalar *)acc,out32,(int *)0x0);
      pcStack_160 = (code *)0x164650;
      test_ecmult_accumulate(&local_98,(secp256k1_scalar *)acc,psVar4);
      sVar10 = sVar10 + 1;
    } while (iter != sVar10);
  }
  pcStack_160 = (code *)0x16466a;
  secp256k1_sha256_finalize(&local_98,local_148);
  lVar6 = 0;
  uVar11 = extraout_RAX;
  do {
    uVar9 = uVar11 & 0xffffffff;
    bVar1 = local_148[lVar6];
    psVar7 = (secp256k1_scalar *)(ulong)bVar1;
    bVar2 = local_150[lVar6];
    hash_00 = (secp256k1_gej *)(ulong)bVar2;
    uVar11 = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      uVar11 = uVar9;
    }
    iVar3 = (int)uVar11;
    if (bVar1 != bVar2) goto LAB_00164694;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  iVar3 = 0;
LAB_00164694:
  if (iVar3 == 0) {
    pcStack_160 = (code *)0x1646ac;
    secp256k1_scratch_destroy(&CTX->error_callback,psVar4);
    return;
  }
  pcStack_160 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  sStack_ce0.d[2] = 0;
  sStack_ce0.d[3] = 0;
  sStack_ce0.d[0] = 0;
  sStack_ce0.d[1] = 0;
  sStack_ce8 = 0x41;
  sStack_a20.infinity = 0;
  sStack_a20.x.n[0] = 0x2815b16f81798;
  sStack_a20.x.n[1] = 0xdb2dce28d959f;
  sStack_a20.x.n[2] = 0xe870b07029bfc;
  sStack_a20.x.n[3] = 0xbbac55a06295c;
  sStack_a20.x.n[4] = 0x79be667ef9dc;
  sStack_a20.y.n[4] = 0x483ada7726a3;
  sStack_a20.y.n[0] = 0x7d08ffb10d4b8;
  sStack_a20.y.n[1] = 0x48a68554199c4;
  sStack_a20.y.n[2] = 0xe1108a8fd17b4;
  sStack_a20.y.n[3] = 0xc4655da4fbfc0;
  sStack_a20.z.n[0] = 1;
  sStack_a20.z.n[3] = 0;
  sStack_a20.z.n[4] = 0;
  sStack_a20.z.n[1] = 0;
  sStack_a20.z.n[2] = 0;
  sStack_aa0.infinity = 1;
  sStack_aa0.z.n[4] = 0;
  sStack_aa0.z.n[2] = 0;
  sStack_aa0.z.n[3] = 0;
  sStack_aa0.z.n[0] = 0;
  sStack_aa0.z.n[1] = 0;
  sStack_aa0.y.n[3] = 0;
  sStack_aa0.y.n[4] = 0;
  sStack_aa0.y.n[1] = 0;
  sStack_aa0.y.n[2] = 0;
  sStack_aa0.x.n[4] = 0;
  sStack_aa0.y.n[0] = 0;
  sStack_aa0.x.n[2] = 0;
  sStack_aa0.x.n[3] = 0;
  sStack_aa0.x.n[0] = 0;
  sStack_aa0.x.n[1] = 0;
  psStack_d08 = (secp256k1_strauss_point_state *)0x1647a8;
  sStack_188 = sVar10;
  psStack_180 = hash;
  psStack_178 = psVar4;
  psStack_170 = acc;
  sStack_168 = iter;
  pcStack_160 = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b20,psVar7);
  psStack_d08 = (secp256k1_strauss_point_state *)0x1647f3;
  sStack_c20.x.n[0] = (uint64_t)asStack_9a0;
  sStack_c20.x.n[1] = (uint64_t)asStack_860;
  sStack_c20.x.n[2] = (uint64_t)&sStack_5a0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_c20,&sStack_ba0,1,&sStack_a20,psVar7,&sStack_ce0);
  psStack_d08 = (secp256k1_strauss_point_state *)0x164824;
  sStack_c78.x.n[0] = (uint64_t)asStack_9a0;
  sStack_c78.x.n[1] = (uint64_t)asStack_860;
  sStack_c78.x.n[2] = (uint64_t)&sStack_5a0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_c78,&sStack_c20,1,&sStack_aa0,&sStack_ce0,psVar7);
  psStack_d08 = (secp256k1_strauss_point_state *)0x16484d;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,(secp256k1_gej *)&sStack_5a0,psVar7,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_d08 = (secp256k1_strauss_point_state *)0x164878;
  cbdata = psVar7;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,asStack_860,&sStack_ce0,test_ecmult_accumulate_cb,
             psVar7,1);
  r_00 = asStack_9a0;
  psStack_d08 = (secp256k1_strauss_point_state *)0x164892;
  secp256k1_ecmult_const(r_00,&secp256k1_ge_const_g,psVar7);
  psStack_d08 = (secp256k1_strauss_point_state *)0x1648aa;
  secp256k1_ge_set_gej_var(&sStack_c78,&sStack_b20);
  psStack_d08 = (secp256k1_strauss_point_state *)0x1648ba;
  ge_equals_gej(&sStack_c78,&sStack_ba0);
  psStack_d08 = (secp256k1_strauss_point_state *)0x1648c5;
  ge_equals_gej(&sStack_c78,&sStack_c20);
  psStack_d08 = (secp256k1_strauss_point_state *)0x1648d0;
  ge_equals_gej(&sStack_c78,(secp256k1_gej *)&sStack_5a0);
  psStack_d08 = (secp256k1_strauss_point_state *)0x1648db;
  ge_equals_gej(&sStack_c78,asStack_860);
  psStack_d08 = (secp256k1_strauss_point_state *)0x1648e6;
  ge_equals_gej(&sStack_c78,r_00);
  if (sStack_c78.infinity == 0) {
    elem = &sStack_c78;
    psVar4 = asStack_cc0;
    psVar7 = (secp256k1_scalar *)0x0;
    psStack_d08 = (secp256k1_strauss_point_state *)0x164922;
    secp256k1_eckey_pubkey_serialize(elem,psVar4->magic,&sStack_ce8,0);
    if (sStack_ce8 != 0x41) {
      psStack_d08 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      r->infinity = 1;
      (r->x).n[0] = 0;
      (r->x).n[1] = 0;
      (r->x).n[2] = 0;
      (r->x).n[3] = 0;
      (r->x).n[4] = 0;
      (r->y).n[0] = 0;
      (r->y).n[1] = 0;
      (r->y).n[2] = 0;
      (r->y).n[3] = 0;
      (r->y).n[4] = 0;
      (r->z).n[0] = 0;
      (r->z).n[1] = 0;
      (r->z).n[2] = 0;
      (r->z).n[3] = 0;
      (r->z).n[4] = 0;
      if (psVar7 != (secp256k1_scalar *)0x0 || hash_00 != (secp256k1_gej *)0x0) {
        psStack_d30 = &sStack_ce8;
        psStack_d28 = &sStack_c20;
        psStack_d20 = asStack_860;
        psStack_d18 = hash_00;
        psStack_d10 = r_00;
        psStack_d08 = &sStack_5a0;
        if (hash_00 != (secp256k1_gej *)0x0) {
          if (psVar4 != (secp256k1_scratch *)0x0) {
            sVar10 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,psVar4);
            if (sVar10 != 0) {
              uVar11 = 5000000;
              if (sVar10 < 5000000) {
                uVar11 = sVar10;
              }
              uStack_1578 = (ulong)&hash_00[-1].field_0x7f / uVar11 + 1;
              r_00 = (secp256k1_gej *)((ulong)&hash_00[-1].field_0x7f / uStack_1578 + 1);
            }
            if (sVar10 != 0) {
              if (r_00 < (secp256k1_gej *)0x58) {
                sVar10 = secp256k1_scratch_max_allocation((secp256k1_callback *)elem,psVar4,5);
                if (0x8af < sVar10) {
                  uVar11 = sVar10 / 0x8b0;
                  if (4999999 < uVar11) {
                    uVar11 = 5000000;
                  }
                  uStack_1578 = (ulong)&hash_00[-1].field_0x7f / uVar11 + 1;
                  r_00 = (secp256k1_gej *)((ulong)&hash_00[-1].field_0x7f / uStack_1578 + 1);
                }
                if (sVar10 < 0x8b0) goto LAB_00164b07;
                pcVar5 = secp256k1_ecmult_strauss_batch;
              }
              else {
                pcVar5 = secp256k1_ecmult_pippenger_batch;
              }
              lVar6 = 0;
              uVar11 = 0;
              while( true ) {
                psVar12 = r_00;
                if (hash_00 < r_00) {
                  psVar12 = hash_00;
                }
                psVar8 = (secp256k1_scalar *)0x0;
                if (uVar11 == 0) {
                  psVar8 = psVar7;
                }
                iVar3 = (*pcVar5)(elem,psVar4,&sStack_1408,psVar8,cb,cbdata,psVar12,lVar6);
                if (iVar3 == 0) break;
                secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1408,(secp256k1_fe *)0x0);
                hash_00 = (secp256k1_gej *)((long)hash_00 - (long)psVar12);
                uVar11 = uVar11 + 1;
                lVar6 = (long)(r_00->x).n + lVar6;
                if (uStack_1578 == uVar11) {
                  return;
                }
              }
              return;
            }
          }
LAB_00164b07:
          secp256k1_ecmult_multi_simple_var(r,psVar7,cb,cbdata,(size_t)hash_00);
          return;
        }
        sStack_1560.aux = asStack_1548;
        sStack_1560.pre_a = asStack_ff8;
        sStack_1560.ps = &sStack_1408;
        secp256k1_ecmult_strauss_wnaf(&sStack_1560,r,1,r,&secp256k1_scalar_zero,psVar7);
      }
      return;
    }
    sVar10 = 0x41;
  }
  else {
    asStack_cc0[0].magic[0] = '\0';
    sVar10 = 1;
  }
  psStack_d08 = (secp256k1_strauss_point_state *)0x164938;
  secp256k1_sha256_write((secp256k1_sha256 *)hash_00,asStack_cc0[0].magic,sVar10);
  return;
}

Assistant:

static void test_ecmult_constants_sha(uint32_t prefix, size_t iter, const unsigned char* expected32) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - Key 0
     * - Key 1
     * - Key -1
     * - For i in range(iter):
     *   - Key SHA256(LE32(prefix) || LE16(i))
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    unsigned char inp[6];
    size_t i;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    inp[0] = prefix & 0xFF;
    inp[1] = (prefix >> 8) & 0xFF;
    inp[2] = (prefix >> 16) & 0xFF;
    inp[3] = (prefix >> 24) & 0xFF;
    secp256k1_sha256_initialize(&acc);
    secp256k1_scalar_set_int(&x, 0);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_set_int(&x, 1);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_negate(&x, &x);
    test_ecmult_accumulate(&acc, &x, scratch);

    for (i = 0; i < iter; ++i) {
        secp256k1_sha256 gen;
        inp[4] = i & 0xff;
        inp[5] = (i >> 8) & 0xff;
        secp256k1_sha256_initialize(&gen);
        secp256k1_sha256_write(&gen, inp, sizeof(inp));
        secp256k1_sha256_finalize(&gen, b32);
        secp256k1_scalar_set_b32(&x, b32, NULL);
        test_ecmult_accumulate(&acc, &x, scratch);
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}